

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FileOptions::ByteSizeLong(FileOptions *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  FileOptions *in_RDI;
  int cached_size;
  UninterpretedOption *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *__range2;
  uint32 cached_has_bits;
  size_t total_size;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  reference in_stack_ffffffffffffffa0;
  iterator local_58;
  RepeatedPtrIterator<const_google::protobuf::UninterpretedOption> local_50;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *local_48;
  uint local_3c;
  size_t local_38;
  size_t local_28;
  InternalMetadataWithArena *local_20;
  undefined4 local_14;
  HasBits<1UL> *local_10;
  InternalMetadataWithArena *local_8;
  
  local_38 = 0;
  sVar3 = internal::ExtensionSet::ByteSize((ExtensionSet *)in_stack_ffffffffffffffa0);
  local_38 = sVar3 + local_38;
  local_3c = 0;
  iVar2 = _internal_uninterpreted_option_size((FileOptions *)0x5084b1);
  local_38 = (long)iVar2 * 2 + local_38;
  local_48 = &in_RDI->uninterpreted_option_;
  local_50.it_ = (void **)RepeatedPtrField<google::protobuf::UninterpretedOption>::begin
                                    ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)
                                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_58.it_ = (void **)RepeatedPtrField<google::protobuf::UninterpretedOption>::end
                                    ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)
                                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while (bVar1 = internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::
                 operator!=(&local_50,&local_58), bVar1) {
    in_stack_ffffffffffffffa0 =
         internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator*
                   (&local_50);
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>
                      ((UninterpretedOption *)0x50851d);
    local_38 = sVar3 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator++
              (&local_50);
  }
  local_10 = &in_RDI->_has_bits_;
  local_14 = 0;
  local_3c = local_10->has_bits_[0];
  if ((local_3c & 0xff) != 0) {
    if ((local_3c & 1) != 0) {
      _internal_java_package_abi_cxx11_((FileOptions *)0x508582);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x50858a);
      local_38 = sVar3 + 1 + local_38;
    }
    if ((local_3c & 2) != 0) {
      _internal_java_outer_classname_abi_cxx11_((FileOptions *)0x5085ae);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x5085b6);
      local_38 = sVar3 + 1 + local_38;
    }
    if ((local_3c & 4) != 0) {
      _internal_go_package_abi_cxx11_((FileOptions *)0x5085da);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x5085e2);
      local_38 = sVar3 + 1 + local_38;
    }
    if ((local_3c & 8) != 0) {
      _internal_objc_class_prefix_abi_cxx11_((FileOptions *)0x508606);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x50860e);
      local_38 = sVar3 + 2 + local_38;
    }
    if ((local_3c & 0x10) != 0) {
      _internal_csharp_namespace_abi_cxx11_((FileOptions *)0x508632);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x50863a);
      local_38 = sVar3 + 2 + local_38;
    }
    if ((local_3c & 0x20) != 0) {
      _internal_swift_prefix_abi_cxx11_((FileOptions *)0x50865e);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x508666);
      local_38 = sVar3 + 2 + local_38;
    }
    if ((local_3c & 0x40) != 0) {
      _internal_php_class_prefix_abi_cxx11_((FileOptions *)0x50868a);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x508692);
      local_38 = sVar3 + 2 + local_38;
    }
    if ((local_3c & 0x80) != 0) {
      _internal_php_namespace_abi_cxx11_((FileOptions *)0x5086b8);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x5086c0);
      local_38 = sVar3 + 2 + local_38;
    }
  }
  if ((local_3c & 0xff00) != 0) {
    if ((local_3c & 0x100) != 0) {
      _internal_php_metadata_namespace_abi_cxx11_((FileOptions *)0x5086fa);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x508702);
      local_38 = sVar3 + 2 + local_38;
    }
    if ((local_3c & 0x200) != 0) {
      _internal_ruby_package_abi_cxx11_((FileOptions *)0x508728);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x508730);
      local_38 = sVar3 + 2 + local_38;
    }
    if ((local_3c & 0x400) != 0) {
      local_38 = local_38 + 2;
    }
    if ((local_3c & 0x800) != 0) {
      local_38 = local_38 + 3;
    }
    if ((local_3c & 0x1000) != 0) {
      local_38 = local_38 + 3;
    }
    if ((local_3c & 0x2000) != 0) {
      local_38 = local_38 + 3;
    }
    if ((local_3c & 0x4000) != 0) {
      local_38 = local_38 + 3;
    }
    if ((local_3c & 0x8000) != 0) {
      local_38 = local_38 + 3;
    }
  }
  if ((local_3c & 0xf0000) != 0) {
    if ((local_3c & 0x10000) != 0) {
      local_38 = local_38 + 3;
    }
    if ((local_3c & 0x20000) != 0) {
      local_38 = local_38 + 3;
    }
    if ((local_3c & 0x40000) != 0) {
      local_38 = local_38 + 3;
    }
    if ((local_3c & 0x80000) != 0) {
      _internal_optimize_for(in_RDI);
      sVar3 = internal::WireFormatLite::EnumSize(0);
      local_38 = sVar3 + 1 + local_38;
    }
  }
  local_20 = &in_RDI->_internal_metadata_;
  local_8 = local_20;
  if (((uint)(local_20->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_28 = internal::ComputeUnknownFieldsSize
                         ((InternalMetadataWithArena *)in_stack_ffffffffffffffa0,
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          (CachedSize *)in_RDI);
  }
  else {
    internal::ToCachedSize(local_38);
    SetCachedSize(in_RDI,in_stack_ffffffffffffff8c);
    local_28 = local_38;
  }
  return local_28;
}

Assistant:

size_t FileOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2UL * this->_internal_uninterpreted_option_size();
  for (const auto& msg : this->uninterpreted_option_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    // optional string java_package = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_java_package());
    }

    // optional string java_outer_classname = 8;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_java_outer_classname());
    }

    // optional string go_package = 11;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_go_package());
    }

    // optional string objc_class_prefix = 36;
    if (cached_has_bits & 0x00000008u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_objc_class_prefix());
    }

    // optional string csharp_namespace = 37;
    if (cached_has_bits & 0x00000010u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_csharp_namespace());
    }

    // optional string swift_prefix = 39;
    if (cached_has_bits & 0x00000020u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_swift_prefix());
    }

    // optional string php_class_prefix = 40;
    if (cached_has_bits & 0x00000040u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_php_class_prefix());
    }

    // optional string php_namespace = 41;
    if (cached_has_bits & 0x00000080u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_php_namespace());
    }

  }
  if (cached_has_bits & 0x0000ff00u) {
    // optional string php_metadata_namespace = 44;
    if (cached_has_bits & 0x00000100u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_php_metadata_namespace());
    }

    // optional string ruby_package = 45;
    if (cached_has_bits & 0x00000200u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_ruby_package());
    }

    // optional bool java_multiple_files = 10 [default = false];
    if (cached_has_bits & 0x00000400u) {
      total_size += 1 + 1;
    }

    // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
    if (cached_has_bits & 0x00000800u) {
      total_size += 2 + 1;
    }

    // optional bool java_string_check_utf8 = 27 [default = false];
    if (cached_has_bits & 0x00001000u) {
      total_size += 2 + 1;
    }

    // optional bool cc_generic_services = 16 [default = false];
    if (cached_has_bits & 0x00002000u) {
      total_size += 2 + 1;
    }

    // optional bool java_generic_services = 17 [default = false];
    if (cached_has_bits & 0x00004000u) {
      total_size += 2 + 1;
    }

    // optional bool py_generic_services = 18 [default = false];
    if (cached_has_bits & 0x00008000u) {
      total_size += 2 + 1;
    }

  }
  if (cached_has_bits & 0x000f0000u) {
    // optional bool php_generic_services = 42 [default = false];
    if (cached_has_bits & 0x00010000u) {
      total_size += 2 + 1;
    }

    // optional bool deprecated = 23 [default = false];
    if (cached_has_bits & 0x00020000u) {
      total_size += 2 + 1;
    }

    // optional bool cc_enable_arenas = 31 [default = false];
    if (cached_has_bits & 0x00040000u) {
      total_size += 2 + 1;
    }

    // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
    if (cached_has_bits & 0x00080000u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_optimize_for());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}